

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  int i;
  Status stat;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  pointer pnVar2;
  long lVar3;
  type_conflict5 tVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  pointer pnVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  ulong uVar10;
  byte bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  
  bVar11 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->theCoPvec->thedelta);
  pUVar1 = this->theCoPvec;
  leavetol(&pricingTol,this);
  (this->updateViols).super_IdxSet.num = 0;
  this_00 = &this->m_pricingViol;
  lVar3 = 0x1c;
  for (uVar10 = (ulong)(uint)(pUVar1->thedelta).super_IdxSet.num; 0 < (int)uVar10;
      uVar10 = uVar10 - 1) {
    i = (pUVar1->thedelta).super_IdxSet.idx[uVar10 - 1];
    stat = ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.costat)->data[i];
    if (this->theRep * stat < 1) {
      if (this->m_pricingViolUpToDate == true) {
        pnVar2 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar6 = &pricingTol;
        pnVar7 = &result;
        for (lVar5 = lVar3; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar7->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
          pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar6 + ((ulong)bVar11 * -2 + 1) * 4);
          pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar4 = boost::multiprecision::operator<(pnVar2 + i,&result);
        if (tVar4) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&this_00->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
        }
      }
      coTest(&result,this,i,stat);
      pnVar2 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar6 = &result;
      pnVar8 = pnVar2 + i;
      for (lVar5 = lVar3; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar8->m_backend).data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar11 * -2 + 1) * 4);
        pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar11 * -2 + 1) * 4);
      }
      pnVar2[i].m_backend.exp = result.m_backend.exp;
      pnVar2[i].m_backend.neg = result.m_backend.neg;
      pnVar2[i].m_backend.fpclass = result.m_backend.fpclass;
      pnVar2[i].m_backend.prec_elem = result.m_backend.prec_elem;
      pnVar6 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start + i;
      if (this->sparsePricingEnter == true) {
        pnVar7 = &pricingTol;
        pnVar9 = &result;
        for (lVar5 = lVar3; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
          pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar4 = boost::multiprecision::operator<(pnVar6,&result);
        if (tVar4) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          if ((this->isInfeasible).data[i] == 0) {
            DIdxSet::addIdx(&this->infeasibilities,i);
            (this->isInfeasible).data[i] = 1;
          }
          if (this->hyperPricingEnter != false) {
            DIdxSet::addIdx(&this->updateViols,i);
          }
        }
        else {
          (this->isInfeasible).data[i] = 0;
        }
      }
      else {
        pnVar7 = &pricingTol;
        pnVar9 = &result;
        for (lVar5 = lVar3; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
          pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
        }
        result.m_backend.exp = pricingTol.m_backend.exp;
        result.m_backend.neg = pricingTol.m_backend.neg;
        result.m_backend.fpclass = pricingTol.m_backend.fpclass;
        result.m_backend.prec_elem = pricingTol.m_backend.prec_elem;
        if (pricingTol.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(pricingTol.m_backend.neg ^ 1);
        }
        tVar4 = boost::multiprecision::operator<(pnVar6,&result);
        if (tVar4) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
        }
      }
    }
    else {
      (this->isInfeasible).data[i] = 0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theCoTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateCoTest()
{
   theCoPvec->delta().setup();

   const IdxSet& idx = theCoPvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViols.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolUpToDate && theCoTest[j] < -pricingTol)
            m_pricingViol += theCoTest[j];

         theCoTest[j] = coTest(j, stat);

         if(sparsePricingEnter)
         {
            if(theCoTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnter == 0);
               m_pricingViol -= theCoTest[j];

               if(isInfeasible[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  //                if( !hyperPricingEnter )
                  infeasibilities.addIdx(j);
                  isInfeasible[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViols.addIdx(j);
            }
            else
            {
               // @todo do we need to remove index j from infeasibilitiesCo?
               isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theCoTest[j] < -pricingTol)
            m_pricingViol -= theCoTest[j];
      }
      else
      {
         isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
         theCoTest[j] = 0;
      }
   }
}